

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

char * jsonnet_evaluate_snippet(JsonnetVm *vm,char *filename,char *snippet,int *error)

{
  char *pcVar1;
  bad_alloc *anon_var_0;
  exception *e;
  EvalKind in_stack_000005bc;
  int *in_stack_000005c0;
  char *in_stack_000005c8;
  char *in_stack_000005d0;
  JsonnetVm *in_stack_000005d8;
  
  pcVar1 = jsonnet_evaluate_snippet_aux
                     (in_stack_000005d8,in_stack_000005d0,in_stack_000005c8,in_stack_000005c0,
                      in_stack_000005bc);
  return pcVar1;
}

Assistant:

char *jsonnet_evaluate_snippet(JsonnetVm *vm, const char *filename, const char *snippet, int *error)
{
    TRY
        return jsonnet_evaluate_snippet_aux(vm, filename, snippet, error, REGULAR);
    CATCH("jsonnet_evaluate_snippet")
    return nullptr;  // Never happens.
}